

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pjson.h
# Opt level: O3

bool __thiscall pjson::document::deserialize_start(document *this,uint8 *pStr)

{
  byte *pbVar1;
  byte bVar2;
  chunk *pcVar3;
  bool bVar4;
  long lVar5;
  ulong uVar6;
  byte *pbVar7;
  char *pcVar8;
  chunk *pcVar9;
  byte bVar10;
  chunk *__ptr;
  
  (this->super_value_variant).super_value_variant_data.m_data.m_object.m_p = (key_value_t *)0x0;
  (this->super_value_variant).super_value_variant_data.m_type = cJSONValueTypeNull;
  __ptr = (this->m_allocator).m_pActive_chunks;
  if (__ptr != (chunk *)0x0) {
    lVar5 = 0;
    pcVar3 = __ptr;
    do {
      pcVar9 = pcVar3;
      lVar5 = lVar5 + pcVar9->m_size;
      pcVar9->m_ofs = 0;
      pcVar3 = pcVar9->m_pNext;
    } while (pcVar9->m_pNext != (chunk *)0x0);
    pcVar9->m_pNext = (this->m_allocator).m_pFree_chunks;
    (this->m_allocator).m_pFree_chunks = __ptr;
    (this->m_allocator).m_pActive_chunks = (chunk *)0x0;
    uVar6 = lVar5 + (this->m_allocator).m_total_free_bytes;
    (this->m_allocator).m_total_free_bytes = uVar6;
    while ((this->m_allocator).m_max_to_preserve_across_resets < uVar6) {
      if (__ptr == (chunk *)0x0) {
        __assert_fail("m_pFree_chunks",
                      "/workspace/llm4binary/github/license_c_cmakelists/0x000N3X4N[P]anonfile/json_handler/../pjson/pjson.h"
                      ,0x120,"void pjson::pool_allocator::reset()");
      }
      if (uVar6 < __ptr->m_size) {
        __assert_fail("m_total_free_bytes >= m_pFree_chunks->m_size",
                      "/workspace/llm4binary/github/license_c_cmakelists/0x000N3X4N[P]anonfile/json_handler/../pjson/pjson.h"
                      ,0x122,"void pjson::pool_allocator::reset()");
      }
      pcVar3 = __ptr->m_pNext;
      (this->m_allocator).m_total_free_bytes = uVar6 - __ptr->m_size;
      free(__ptr);
      (this->m_allocator).m_pFree_chunks = pcVar3;
      __ptr = pcVar3;
      uVar6 = (this->m_allocator).m_total_free_bytes;
    }
    (this->m_allocator).m_cur_grow_size = (this->m_allocator).m_min_chunk_size;
  }
  this->m_pStart = pStr;
  pbVar7 = pStr;
LAB_00104b78:
  bVar2 = *pbVar7;
LAB_00104b7b:
  bVar10 = bVar2;
  if (bVar10 < 0x20) {
    if (bVar10 != 9) goto LAB_00104ba0;
  }
  else if (bVar10 != 0x20) {
    if (bVar10 != 0x2f) goto LAB_00104bc7;
    if (pbVar7[1] != 0x2f) goto LAB_00104bd1;
    pbVar7 = pbVar7 + 2;
    while ((0xd < *pbVar7 || ((0x2401U >> (*pbVar7 & 0x1f) & 1) == 0))) {
      pbVar7 = pbVar7 + 1;
    }
    goto LAB_00104b78;
  }
  do {
    pbVar1 = pbVar7 + 1;
    pbVar7 = pbVar7 + 1;
    bVar2 = *pbVar1;
  } while (*pbVar1 == bVar10);
  goto LAB_00104b7b;
LAB_00104ba0:
  if (bVar10 == 0) goto LAB_00104bd1;
LAB_00104bc7:
  if (0x20 < bVar10) goto LAB_00104bd1;
  pbVar7 = pbVar7 + 1;
  goto LAB_00104b78;
LAB_00104c49:
  if (bVar10 == 0) goto LAB_00104c7a;
LAB_00104c70:
  if (0x20 < bVar10) goto LAB_00104c7a;
  pbVar7 = pbVar7 + 1;
  goto LAB_00104c21;
LAB_00104c7a:
  this->m_pStr = pbVar7;
  if (*pbVar7 == 0) {
    return true;
  }
  pStr = this->m_pStart;
  pcVar8 = "Unknown data at end of document";
  goto LAB_00104ca6;
LAB_00104bd1:
  this->m_pStr = pbVar7;
  bVar2 = *pbVar7;
  if (bVar2 == 0) {
    pcVar8 = "Nothing to deserialize";
  }
  else {
    if ((bVar2 == 0x7b) || (bVar2 == 0x5b)) {
      (this->super_value_variant).super_value_variant_data.m_type =
           (bVar2 == 0x7b) + cJSONValueTypeArray;
      (this->super_value_variant).super_value_variant_data.m_data.m_object.m_p = (key_value_t *)0x0;
      *(undefined8 *)((long)&(this->super_value_variant).super_value_variant_data.m_data + 8) = 0;
      bVar4 = deserialize_internal(this);
      if (!bVar4) {
        return false;
      }
      pbVar7 = this->m_pStr;
LAB_00104c21:
      bVar2 = *pbVar7;
LAB_00104c24:
      bVar10 = bVar2;
      if (bVar10 < 0x20) {
        if (bVar10 != 9) goto LAB_00104c49;
      }
      else if (bVar10 != 0x20) {
        if (bVar10 != 0x2f) goto LAB_00104c70;
        if (pbVar7[1] != 0x2f) goto LAB_00104c7a;
        pbVar7 = pbVar7 + 2;
        while ((0xd < *pbVar7 || ((0x2401U >> (*pbVar7 & 0x1f) & 1) == 0))) {
          pbVar7 = pbVar7 + 1;
        }
        goto LAB_00104c21;
      }
      do {
        pbVar1 = pbVar7 + 1;
        pbVar7 = pbVar7 + 1;
        bVar2 = *pbVar1;
      } while (*pbVar1 == bVar10);
      goto LAB_00104c24;
    }
    pcVar8 = "Root value must be an object or array";
  }
LAB_00104ca6:
  (this->m_error_info).m_ofs = (long)pbVar7 - (long)pStr;
  (this->m_error_info).m_pError_message = pcVar8;
  return false;
}

Assistant:

bool deserialize_start(uint8* pStr)
      {
         set_to_null();

#if PJSON_PARSE_STATS
         m_parse_stats.clear();
#endif

         m_allocator.reset();

         m_pStart = pStr;
         
         m_pStr = skip_whitespace(pStr);
         
         if (!*m_pStr)
            return set_error(m_pStr, "Nothing to deserialize");

         bool success = false;

         uint8 c = *m_pStr;
         if ((c == '{') || (c == '['))
         {
            set_to_node(c == '{'); PJSON_INCREMENT_STAT(m_num_control);
            success = deserialize_internal();
         }
         else
            return set_error(m_pStr, "Root value must be an object or array");

         if (success)
         {
            m_pStr = skip_whitespace(m_pStr);
            success = !*m_pStr;
            if (!success)
               set_error(m_pStr, "Unknown data at end of document");
         }

         return success;
      }